

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O3

void duckdb::BinaryTrimFunction<false,true>(DataChunk *input,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  data_ptr_t pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  reference vector;
  reference vector_00;
  idx_t iVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  sel_t *psVar19;
  idx_t iVar20;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  ulong uVar21;
  idx_t iVar22;
  ulong uVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  string_t sVar26;
  anon_struct_16_3_d7536bce_for_pointer aVar27;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  sel_t *idx;
  idx_t local_108;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      aVar27 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector_00->data)->pointer
                          ,in_R9,in_stack_fffffffffffffee8);
      paVar4->pointer = aVar27;
      return;
    }
  }
  else {
    local_108 = input->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      paVar4 = (anon_union_16_2_67f50693_for_value *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_108 == 0) {
            return;
          }
          aVar27 = paVar4->pointer;
          lVar16 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar16);
            left_02.value._0_8_ = *(undefined8 *)(pdVar25 + lVar16 + -8);
            sVar26 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)aVar27,in_R9,
                                in_stack_fffffffffffffee8);
            *(long *)(pdVar5 + lVar16 + -8) = sVar26.value._0_8_;
            *(long *)(pdVar5 + lVar16) = sVar26.value._8_8_;
            lVar16 = lVar16 + 0x10;
            local_108 = local_108 - 1;
          } while (local_108 != 0);
          return;
        }
        if (local_108 + 0x3f < 0x40) {
          return;
        }
        uVar14 = 0;
        uVar24 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar18 = uVar24 + 0x40;
            if (local_108 <= uVar24 + 0x40) {
              uVar18 = local_108;
            }
LAB_010405fb:
            uVar17 = uVar24;
            if (uVar24 < uVar18) {
              aVar27 = paVar4->pointer;
              uVar15 = uVar24 << 4 | 8;
              uVar17 = uVar18;
              do {
                left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar15);
                left_00.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar15 - 8));
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_00,(string_t)aVar27,in_R9,
                                    uVar17);
                *(long *)(pdVar5 + (uVar15 - 8)) = sVar26.value._0_8_;
                *(long *)(pdVar5 + uVar15) = sVar26.value._8_8_;
                uVar24 = uVar24 + 1;
                uVar15 = uVar15 + 0x10;
              } while (uVar17 != uVar24);
            }
          }
          else {
            uVar15 = puVar3[uVar14];
            uVar18 = uVar24 + 0x40;
            if (local_108 <= uVar24 + 0x40) {
              uVar18 = local_108;
            }
            uVar17 = uVar18;
            if (uVar15 != 0) {
              if (uVar15 == 0xffffffffffffffff) goto LAB_010405fb;
              uVar17 = uVar24;
              if (uVar24 < uVar18) {
                uVar23 = uVar24 << 4 | 8;
                uVar21 = 0;
                uVar17 = uVar18;
                do {
                  if ((uVar15 >> (uVar21 & 0x3f) & 1) != 0) {
                    left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar23);
                    left.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar23 - 8));
                    sVar26 = BinaryLambdaWrapper::
                             Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left,
                                        (string_t)paVar4->pointer,in_R9,uVar17);
                    *(long *)(pdVar5 + (uVar23 - 8)) = sVar26.value._0_8_;
                    *(long *)(pdVar5 + uVar23) = sVar26.value._8_8_;
                  }
                  uVar21 = uVar21 + 1;
                  uVar23 = uVar23 + 0x10;
                } while (uVar18 - uVar24 != uVar21);
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar24 = uVar17;
          if (uVar14 == local_108 + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar25 = vector->data;
          pdVar5 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,local_108);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_108 != 0) {
              lVar16 = 8;
              do {
                sVar26.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar16);
                sVar26.value._0_8_ = *(undefined8 *)(pdVar25 + lVar16 + -8);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + lVar16);
                right_06.value._0_8_ = *(undefined8 *)(pdVar5 + lVar16 + -8);
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar26,right_06,in_R9,
                                    in_stack_fffffffffffffee8);
                *(long *)(pdVar7 + lVar16 + -8) = sVar26.value._0_8_;
                *(long *)(pdVar7 + lVar16) = sVar26.value._8_8_;
                lVar16 = lVar16 + 0x10;
                local_108 = local_108 - 1;
              } while (local_108 != 0);
            }
          }
          else if (0x3f < local_108 + 0x3f) {
            uVar14 = 0;
            uVar24 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar18 = uVar14 + 0x40;
                if (local_108 <= uVar14 + 0x40) {
                  uVar18 = local_108;
                }
LAB_01040b52:
                uVar17 = uVar14;
                if (uVar14 < uVar18) {
                  uVar15 = uVar14 << 4 | 8;
                  do {
                    left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar15);
                    left_04.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar15 - 8));
                    right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + uVar15);
                    right_03.value._0_8_ = *(undefined8 *)(pdVar5 + (uVar15 - 8));
                    sVar26 = BinaryLambdaWrapper::
                             Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                        uVar18);
                    *(long *)(pdVar7 + (uVar15 - 8)) = sVar26.value._0_8_;
                    *(long *)(pdVar7 + uVar15) = sVar26.value._8_8_;
                    uVar14 = uVar14 + 1;
                    uVar15 = uVar15 + 0x10;
                    uVar17 = uVar18;
                  } while (uVar18 != uVar14);
                }
              }
              else {
                uVar15 = puVar3[uVar24];
                uVar18 = uVar14 + 0x40;
                if (local_108 <= uVar14 + 0x40) {
                  uVar18 = local_108;
                }
                uVar17 = uVar18;
                if (uVar15 != 0) {
                  if (uVar15 == 0xffffffffffffffff) goto LAB_01040b52;
                  uVar21 = uVar18 - uVar14;
                  uVar17 = uVar14;
                  if (uVar14 < uVar18) {
                    uVar14 = uVar14 << 4 | 8;
                    uVar23 = 0;
                    do {
                      if ((uVar15 >> (uVar23 & 0x3f) & 1) != 0) {
                        left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar14);
                        left_03.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar14 - 8));
                        right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar5 + uVar14);
                        right_02.value._0_8_ = *(undefined8 *)(pdVar5 + (uVar14 - 8));
                        sVar26 = BinaryLambdaWrapper::
                                 Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                           ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,
                                            uVar18);
                        *(long *)(pdVar7 + (uVar14 - 8)) = sVar26.value._0_8_;
                        *(long *)(pdVar7 + uVar14) = sVar26.value._8_8_;
                      }
                      uVar23 = uVar23 + 1;
                      uVar14 = uVar14 + 0x10;
                      uVar17 = uVar18;
                    } while (uVar21 != uVar23);
                  }
                }
              }
              uVar14 = uVar17;
              uVar24 = uVar24 + 1;
            } while (uVar24 != local_108 + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,local_108,&local_78);
          Vector::ToUnifiedFormat(vector_00,local_108,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar25 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_108 != 0) {
              psVar6 = (local_78.sel)->sel_vector;
              psVar19 = (local_c0.sel)->sel_vector;
              pdVar25 = pdVar25 + 8;
              iVar22 = 0;
              do {
                iVar11 = iVar22;
                if (psVar6 != (sel_t *)0x0) {
                  iVar11 = (idx_t)psVar6[iVar22];
                }
                iVar20 = iVar22;
                if (psVar19 != (sel_t *)0x0) {
                  iVar20 = (idx_t)psVar19[iVar22];
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + iVar11 * 0x10 + 8);
                left_01.value._0_8_ = *(undefined8 *)(local_78.data + iVar11 * 0x10);
                right.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar20 * 0x10 + 8)
                ;
                right.value._0_8_ = *(undefined8 *)(local_c0.data + iVar20 * 0x10);
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,
                                    in_stack_fffffffffffffee8);
                *(long *)(pdVar25 + -8) = sVar26.value._0_8_;
                *(long *)pdVar25 = sVar26.value._8_8_;
                iVar22 = iVar22 + 1;
                pdVar25 = pdVar25 + 0x10;
              } while (local_108 != iVar22);
            }
          }
          else if (local_108 != 0) {
            psVar6 = (local_78.sel)->sel_vector;
            psVar19 = (local_c0.sel)->sel_vector;
            pdVar25 = pdVar25 + 8;
            uVar24 = 0;
            idx = psVar19;
            do {
              uVar14 = uVar24;
              if (psVar6 != (sel_t *)0x0) {
                uVar14 = (ulong)psVar6[uVar24];
              }
              uVar18 = uVar24;
              if (psVar19 != (sel_t *)0x0) {
                uVar18 = (ulong)psVar19[uVar24];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + uVar14 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(local_78.data + uVar14 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_c0.data + uVar18 * 0x10 + 8);
                right_04.value._0_8_ = *(undefined8 *)(local_c0.data + uVar18 * 0x10);
                psVar19 = idx;
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,
                                    (idx_t)idx);
                *(long *)(pdVar25 + -8) = sVar26.value._0_8_;
                *(long *)pdVar25 = sVar26.value._8_8_;
                idx = psVar19;
              }
              else {
                _Var13._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var13._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var10 = p_Stack_d0;
                  peVar9 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar9;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var10;
                  psVar19 = idx;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     psVar19 = idx,
                     p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                    psVar19 = idx;
                  }
                  pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var13._M_head_impl =
                       (pTVar12->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var13._M_head_impl;
                  idx = psVar19;
                }
                bVar8 = (byte)uVar24 & 0x3f;
                _Var13._M_head_impl[uVar24 >> 6] =
                     _Var13._M_head_impl[uVar24 >> 6] &
                     (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              uVar24 = uVar24 + 1;
              pdVar25 = pdVar25 + 0x10;
            } while (local_108 != uVar24);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar5 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_108 == 0) {
            return;
          }
          aVar27 = paVar4->pointer;
          lVar16 = 8;
          do {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar16);
            right_05.value._0_8_ = *(undefined8 *)(pdVar25 + lVar16 + -8);
            sVar26 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar27,right_05,in_R9,
                                in_stack_fffffffffffffee8);
            *(long *)(pdVar5 + lVar16 + -8) = sVar26.value._0_8_;
            *(long *)(pdVar5 + lVar16) = sVar26.value._8_8_;
            lVar16 = lVar16 + 0x10;
            local_108 = local_108 - 1;
          } while (local_108 != 0);
          return;
        }
        if (local_108 + 0x3f < 0x40) {
          return;
        }
        uVar14 = 0;
        uVar24 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar18 = uVar14 + 0x40;
            if (local_108 <= uVar14 + 0x40) {
              uVar18 = local_108;
            }
LAB_0104091b:
            uVar17 = uVar14;
            if (uVar14 < uVar18) {
              aVar27 = paVar4->pointer;
              uVar15 = uVar14 << 4 | 8;
              do {
                right_01.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar15);
                right_01.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar15 - 8));
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,(string_t)aVar27,right_01,in_R9,
                                    uVar18);
                *(long *)(pdVar5 + (uVar15 - 8)) = sVar26.value._0_8_;
                *(long *)(pdVar5 + uVar15) = sVar26.value._8_8_;
                uVar14 = uVar14 + 1;
                uVar15 = uVar15 + 0x10;
                uVar17 = uVar18;
              } while (uVar18 != uVar14);
            }
          }
          else {
            uVar15 = puVar3[uVar24];
            uVar18 = uVar14 + 0x40;
            if (local_108 <= uVar14 + 0x40) {
              uVar18 = local_108;
            }
            uVar17 = uVar18;
            if (uVar15 != 0) {
              if (uVar15 == 0xffffffffffffffff) goto LAB_0104091b;
              uVar21 = uVar18 - uVar14;
              uVar17 = uVar14;
              if (uVar14 < uVar18) {
                uVar14 = uVar14 << 4 | 8;
                uVar23 = 0;
                do {
                  if ((uVar15 >> (uVar23 & 0x3f) & 1) != 0) {
                    right_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar14);
                    right_00.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar14 - 8));
                    sVar26 = BinaryLambdaWrapper::
                             Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                        right_00,in_R9,uVar18);
                    *(long *)(pdVar5 + (uVar14 - 8)) = sVar26.value._0_8_;
                    *(long *)(pdVar5 + uVar14) = sVar26.value._8_8_;
                  }
                  uVar23 = uVar23 + 1;
                  uVar14 = uVar14 + 0x10;
                  uVar17 = uVar18;
                } while (uVar21 != uVar23);
              }
            }
          }
          uVar14 = uVar17;
          uVar24 = uVar24 + 1;
          if (uVar24 == local_108 + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BinaryTrimFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t input, string_t ignored) {
		    auto data = input.GetData();
		    auto size = input.GetSize();

		    unordered_set<utf8proc_int32_t> ignored_codepoints;
		    GetIgnoredCodepoints(ignored, ignored_codepoints);

		    utf8proc_int32_t codepoint;
		    auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		    // Find the first character that is not left trimmed
		    idx_t begin = 0;
		    if (LTRIM) {
			    while (begin < size) {
				    auto bytes =
				        utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    break;
				    }
				    begin += UnsafeNumericCast<idx_t>(bytes);
			    }
		    }

		    // Find the last character that is not right trimmed
		    idx_t end;
		    if (RTRIM) {
			    end = begin;
			    for (auto next = begin; next < size;) {
				    auto bytes =
				        utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				    D_ASSERT(bytes > 0);
				    next += UnsafeNumericCast<idx_t>(bytes);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    end = next;
				    }
			    }
		    } else {
			    end = size;
		    }

		    // Copy the trimmed string
		    auto target = StringVector::EmptyString(result, end - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, end - begin);

		    target.Finalize();
		    return target;
	    });
}